

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O2

void __thiscall btHashedSimplePairCache::removeAllPairs(btHashedSimplePairCache *this)

{
  btAlignedObjectArray<btSimplePair>::clear(&this->m_overlappingPairArray);
  btAlignedObjectArray<int>::clear(&this->m_hashTable);
  btAlignedObjectArray<int>::clear(&this->m_next);
  btAlignedObjectArray<btSimplePair>::reserve(&this->m_overlappingPairArray,2);
  growTables(this);
  return;
}

Assistant:

void btHashedSimplePairCache::removeAllPairs()
{
	m_overlappingPairArray.clear();
	m_hashTable.clear();
	m_next.clear();

	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}